

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O0

PublicKey * __thiscall
jbcoin::STValidation::getSignerPublic(PublicKey *__return_storage_ptr__,STValidation *this)

{
  Blob local_40;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_28;
  STValidation *local_18;
  STValidation *this_local;
  
  local_18 = this;
  this_local = (STValidation *)__return_storage_ptr__;
  STObject::getFieldVL(&local_40,&this->super_STObject,(SField *)sfSigningPubKey);
  local_28 = makeSlice<unsigned_char,std::allocator<unsigned_char>>(&local_40);
  PublicKey::PublicKey(__return_storage_ptr__,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

PublicKey STValidation::getSignerPublic () const
{
    return PublicKey(makeSlice (getFieldVL (sfSigningPubKey)));
}